

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void pinger_write_ping(pinger_t *pinger)

{
  int iVar1;
  void *pvVar2;
  undefined8 *extraout_RDX;
  undefined8 uVar3;
  long *__size;
  char *pcVar4;
  long lVar5;
  undefined1 auVar6 [16];
  int64_t eval_b;
  int64_t eval_a;
  long local_88;
  long local_80;
  undefined1 local_78 [5] [16];
  
  __size = &local_88;
  if (pinger->vectored_writes == 0) {
    local_78[0] = uv_buf_init(PING,5);
    uVar3 = 1;
  }
  else {
    pcVar4 = PING;
    lVar5 = 8;
    do {
      auVar6 = uv_buf_init(pcVar4,1);
      *(long *)(local_78[-1] + lVar5 + 8) = auVar6._0_8_;
      *(long *)(local_78[0] + lVar5) = auVar6._8_8_;
      pcVar4 = pcVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x58);
    uVar3 = 5;
  }
  pvVar2 = malloc(0xc0);
  if (pvVar2 == (void *)0x0) {
    pinger_write_ping_cold_2();
  }
  else {
    local_80 = 0;
    iVar1 = uv_write(pvVar2,&pinger->stream,local_78,uVar3,pinger_after_write);
    local_88 = (long)iVar1;
    if (local_80 == local_88) {
      puts("PING");
      return;
    }
  }
  pinger_write_ping_cold_1();
  pvVar2 = malloc((size_t)__size);
  *extraout_RDX = pvVar2;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void pinger_write_ping(pinger_t* pinger) {
  uv_stream_t* stream;
  uv_write_t* req;
  uv_buf_t bufs[sizeof PING - 1];
  int i, nbufs;

  stream = (uv_stream_t*) &pinger->stream.tcp;

  if (!pinger->vectored_writes) {
    /* Write a single buffer. */
    nbufs = 1;
    bufs[0] = uv_buf_init(PING, sizeof PING - 1);
  } else {
    /* Write multiple buffers, each with one byte in them. */
    nbufs = sizeof PING - 1;
    for (i = 0; i < nbufs; i++) {
      bufs[i] = uv_buf_init(&PING[i], 1);
    }
  }

  req = malloc(sizeof(*req));
  ASSERT_NOT_NULL(req);
  ASSERT_EQ(0, uv_write(req, stream, bufs, nbufs, pinger_after_write));

  puts("PING");
}